

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afk.cc
# Opt level: O2

void __thiscall AfkProcessor::flow_print(AfkProcessor *this,Params *args)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,
                           (string *)
                           (args->argv_).
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start[1]);
  std::operator<<(poVar1,'\n');
  return;
}

Assistant:

void AfkProcessor::flow_print(flow::Params& args) {
  std::cout << args.getString(1) << '\n';
}